

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double __thiscall pstore::logger::log(logger *this,double __x)

{
  int in_ECX;
  czstring in_RDX;
  uint in_ESI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  string local_38;
  
  to_string<int>(&local_38,in_RDX,in_ECX);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&local_38);
  dVar1 = extraout_XMM0_Qa;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    dVar1 = extraout_XMM0_Qa_00;
  }
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message, int const d) {
            this->log (p, to_string (message, d));
        }